

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::read_node
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  element_type *peVar1;
  bool bVar2;
  bool bVar3;
  longlong lVar4;
  Atom *this_00;
  uint16_t *extent_index_00;
  undefined7 in_register_00000011;
  int iVar5;
  bool bVar6;
  allocator local_130 [7];
  char local_129;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *local_128;
  longlong local_120;
  undefined4 local_114;
  uint16_t *local_110;
  char *p_1;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_88;
  Class local_78;
  
  local_114 = (undefined4)CONCAT71(in_register_00000011,enforce);
  local_128 = &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
  local_110 = extent_index;
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  bVar2 = read_nil_nid(this,(Ptr *)&local_88,write_index,(uint16_t *)p,write);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  bVar6 = true;
  if (!bVar2) {
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e8,local_128);
    Class::Class(&local_78,NODE_ID);
    bVar2 = read_variable(this,(Ptr *)&local_e8,write_index,(uint16_t *)p,write,&local_78);
    Class::~Class(&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
    if (!bVar2) {
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_98,local_128);
      extent_index_00 = local_110;
      bVar2 = read_reference(this,(Ptr *)&local_98,write_index,local_110,write,NODE_ID);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
      if (!bVar2) {
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_a8,local_128);
        bVar2 = read_wildcard(this,(Ptr *)&local_a8,write_index,extent_index_00,write);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
        if (!bVar2) {
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_b8,local_128);
          bVar2 = read_tail_wildcard(this,(Ptr *)&local_b8,write_index,extent_index_00,write);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
          if (!bVar2) {
            peVar1 = local_128->_M_ptr;
            std::__cxx11::string::string((string *)&p_1,"0x",local_130);
            bVar2 = r_code::Utils::StartsWith(&peVar1->cmd,(string *)&p_1);
            std::__cxx11::string::~string((string *)&p_1);
            if ((bVar2) &&
               (lVar4 = strtoll((local_128->_M_ptr->cmd)._M_dataplus._M_p,&p_1,0x10), *p_1 == '\0'))
            {
              local_120 = lVar4;
              r_code::Atom::Atom((Atom *)local_130,(uint)lVar4);
              local_129 = r_code::Atom::getDescriptor();
              bVar2 = local_129 == -0x60;
              r_code::Atom::~Atom((Atom *)local_130);
              if (write && bVar2) {
                r_code::Atom::Atom((Atom *)local_130,(uint)local_120);
                this_00 = r_code::vector<r_code::Atom>::operator[]
                                    ((vector<r_code::Atom> *)(this->current_object + 8),
                                     (ulong)write_index);
                r_code::Atom::operator=(this_00,(Atom *)local_130);
                r_code::Atom::~Atom((Atom *)local_130);
                return true;
              }
              if (local_129 == -0x60) {
                return true;
              }
            }
            local_120 = CONCAT44(local_120._4_4_,(uint)(this->state).pattern_lvl);
            bVar2 = (this->state).no_arity_check;
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_c8,local_128);
            bVar3 = expression(this,(Ptr *)&local_c8,NODE_ID,write_index,local_110,write);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
            if (!bVar3) {
              iVar5 = (uint)bVar2 * 0x10000 + (int)local_120;
              (this->state).pattern_lvl = (uint16_t)iVar5;
              (this->state).no_arity_check = SUB41((uint)iVar5 >> 0x10,0);
              if ((char)local_114 != '\0') {
                std::__cxx11::string::string((string *)&p_1," error: expected a node id",local_130);
                std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_d8,local_128);
                set_error(this,(string *)&p_1,(Ptr *)&local_d8);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_d8._M_refcount);
                std::__cxx11::string::~string((string *)&p_1);
              }
              bVar6 = false;
            }
          }
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool Compiler::read_node(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write) // p always NULL
{
    if (read_nil_nid(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, NODE_ID)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, NODE_ID)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (Utils::StartsWith(node->cmd, "0x")) {
        try {
            char *p;
            uint64_t h = std::strtoll(node->cmd.c_str(), &p, 16);

            if (*p == 0) {
                if (Atom(h).getDescriptor() == Atom::NODE) {
                    if (write) {
                        current_object->code[write_index] = Atom(h);
                    }

                    return true;
                }
            }
        } catch (const std::invalid_argument &ia) { }
    }

    State s = save_state();

    if (expression(node, NODE_ID, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a node id", node);
        return false;
    }

    return false;
}